

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int yaml_parser_parse(yaml_parser_t *parser,yaml_event_t *event)

{
  yaml_parser_state_t **ppyVar1;
  yaml_token_type_t yVar2;
  size_t sVar3;
  yaml_tag_directive_t *pyVar4;
  size_t sVar5;
  size_t sVar6;
  yaml_token_t *pyVar7;
  yaml_char_t *pyVar8;
  yaml_parser_state_t *pyVar9;
  yaml_encoding_t yVar10;
  int iVar11;
  int iVar12;
  yaml_mark_t start_mark;
  yaml_mark_t end_mark;
  size_t local_58;
  size_t sStack_50;
  size_t local_48;
  size_t local_38;
  size_t sStack_30;
  size_t local_28;
  
  if (parser == (yaml_parser_t *)0x0) {
    __assert_fail("parser",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/parser.c"
                  ,0xac,"int yaml_parser_parse(yaml_parser_t *, yaml_event_t *)");
  }
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/parser.c"
                  ,0xad,"int yaml_parser_parse(yaml_parser_t *, yaml_event_t *)");
  }
  (event->end_mark).index = 0;
  (event->end_mark).line = 0;
  (event->start_mark).line = 0;
  (event->start_mark).column = 0;
  *(undefined8 *)((long)&event->data + 0x28) = 0;
  (event->start_mark).index = 0;
  (event->data).scalar.length = 0;
  *(undefined8 *)((long)&event->data + 0x20) = 0;
  (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
  (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
  *(undefined8 *)event = 0;
  (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
  (event->end_mark).column = 0;
  iVar12 = 1;
  if (parser->stream_end_produced != 0) {
    return 1;
  }
  if (parser->error != YAML_NO_ERROR) {
    return 1;
  }
  switch(parser->state) {
  case YAML_PARSE_STREAM_START_STATE:
    if ((parser->token_available != 0) ||
       (iVar12 = yaml_parser_fetch_more_tokens(parser), iVar12 != 0)) {
      pyVar7 = (parser->tokens).head;
      if (pyVar7 == (yaml_token_t *)0x0) {
        return 0;
      }
      if (pyVar7->type != YAML_STREAM_START_TOKEN) {
        sVar3 = (pyVar7->start_mark).column;
        sVar5 = (pyVar7->start_mark).index;
        sVar6 = (pyVar7->start_mark).line;
        parser->error = YAML_PARSER_ERROR;
        parser->problem = "did not find expected <stream-start>";
        (parser->problem_mark).index = sVar5;
        (parser->problem_mark).line = sVar6;
        (parser->problem_mark).column = sVar3;
        return 0;
      }
      parser->state = YAML_PARSE_IMPLICIT_DOCUMENT_START_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->end_mark).column = 0;
      event->type = YAML_STREAM_START_EVENT;
      (event->start_mark).column = (pyVar7->start_mark).column;
      sVar3 = (pyVar7->start_mark).line;
      (event->start_mark).index = (pyVar7->start_mark).index;
      (event->start_mark).line = sVar3;
      sVar3 = (pyVar7->start_mark).line;
      (event->end_mark).index = (pyVar7->start_mark).index;
      (event->end_mark).line = sVar3;
      (event->end_mark).column = (pyVar7->start_mark).column;
      (event->data).stream_start.encoding = (pyVar7->data).stream_start.encoding;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      pyVar7 = (parser->tokens).head;
      parser->stream_end_produced = (uint)(pyVar7->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = pyVar7 + 1;
      return 1;
    }
    break;
  case YAML_PARSE_IMPLICIT_DOCUMENT_START_STATE:
    iVar12 = 1;
    goto LAB_001abb13;
  case YAML_PARSE_DOCUMENT_START_STATE:
    iVar12 = 0;
LAB_001abb13:
    iVar12 = yaml_parser_parse_document_start(parser,event,iVar12);
    return iVar12;
  case YAML_PARSE_DOCUMENT_CONTENT_STATE:
    if (((parser->token_available != 0) ||
        (iVar12 = yaml_parser_fetch_more_tokens(parser), iVar12 != 0)) &&
       (pyVar7 = (parser->tokens).head, pyVar7 != (yaml_token_t *)0x0)) {
      if (pyVar7->type - YAML_STREAM_END_TOKEN < 5) {
        pyVar9 = (parser->states).top;
        (parser->states).top = pyVar9 + -1;
        parser->state = pyVar9[-1];
        goto LAB_001abeda;
      }
      goto switchD_001ab898_caseD_5;
    }
    break;
  case YAML_PARSE_DOCUMENT_END_STATE:
    if (((parser->token_available != 0) ||
        (iVar12 = yaml_parser_fetch_more_tokens(parser), iVar12 != 0)) &&
       (pyVar7 = (parser->tokens).head, pyVar7 != (yaml_token_t *)0x0)) {
      local_28 = (pyVar7->start_mark).column;
      local_38 = (pyVar7->start_mark).index;
      sStack_30 = (pyVar7->start_mark).line;
      sVar3 = (pyVar7->start_mark).column;
      sVar5 = (pyVar7->start_mark).index;
      sVar6 = (pyVar7->start_mark).line;
      yVar10 = YAML_UTF8_ENCODING;
      if (pyVar7->type == YAML_DOCUMENT_END_TOKEN) {
        local_28 = (pyVar7->end_mark).column;
        local_38 = (pyVar7->end_mark).index;
        sStack_30 = (pyVar7->end_mark).line;
        yVar10 = YAML_ANY_ENCODING;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = 0;
        (parser->tokens).head = pyVar7 + 1;
      }
      while (pyVar4 = (parser->tag_directives).top, (parser->tag_directives).start != pyVar4) {
        (parser->tag_directives).top = pyVar4 + -1;
        pyVar8 = pyVar4[-1].prefix;
        yaml_free(pyVar4[-1].handle);
        yaml_free(pyVar8);
      }
      parser->state = YAML_PARSE_DOCUMENT_START_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      event->type = YAML_DOCUMENT_END_EVENT;
      (event->start_mark).index = sVar5;
      (event->start_mark).line = sVar6;
      (event->start_mark).column = sVar3;
      (event->end_mark).index = local_38;
      (event->end_mark).line = sStack_30;
      (event->end_mark).column = local_28;
      (event->data).stream_start.encoding = yVar10;
      return 1;
    }
    break;
  case YAML_PARSE_BLOCK_NODE_STATE:
switchD_001ab898_caseD_5:
    iVar12 = 1;
    goto LAB_001ac0a7;
  case YAML_PARSE_BLOCK_NODE_OR_INDENTLESS_SEQUENCE_STATE:
    iVar12 = 1;
    iVar11 = 1;
    goto LAB_001ac0a9;
  case YAML_PARSE_FLOW_NODE_STATE:
switchD_001ab898_caseD_7:
    iVar12 = 0;
LAB_001ac0a7:
    iVar11 = 0;
LAB_001ac0a9:
    iVar12 = yaml_parser_parse_node(parser,event,iVar12,iVar11);
    return iVar12;
  case YAML_PARSE_BLOCK_SEQUENCE_FIRST_ENTRY_STATE:
    iVar12 = 1;
    goto LAB_001abe18;
  case YAML_PARSE_BLOCK_SEQUENCE_ENTRY_STATE:
    iVar12 = 0;
LAB_001abe18:
    iVar12 = yaml_parser_parse_block_sequence_entry(parser,event,iVar12);
    return iVar12;
  case YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE:
    if (((parser->token_available != 0) ||
        (iVar12 = yaml_parser_fetch_more_tokens(parser), iVar12 != 0)) &&
       (pyVar7 = (parser->tokens).head, pyVar7 != (yaml_token_t *)0x0)) {
      if (pyVar7->type != YAML_BLOCK_ENTRY_TOKEN) {
        pyVar9 = (parser->states).top;
        (parser->states).top = pyVar9 + -1;
        parser->state = pyVar9[-1];
        *(undefined8 *)event = 0;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        (event->end_mark).index = 0;
        (event->end_mark).line = 0;
        (event->start_mark).line = 0;
        (event->start_mark).column = 0;
        *(undefined8 *)((long)&event->data + 0x28) = 0;
        (event->start_mark).index = 0;
        (event->data).scalar.length = 0;
        *(undefined8 *)((long)&event->data + 0x20) = 0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
        (event->end_mark).column = 0;
        event->type = YAML_SEQUENCE_END_EVENT;
        sVar3 = (pyVar7->start_mark).line;
        (event->start_mark).index = (pyVar7->start_mark).index;
        (event->start_mark).line = sVar3;
        (event->start_mark).column = (pyVar7->start_mark).column;
        sVar3 = (pyVar7->start_mark).line;
        (event->end_mark).index = (pyVar7->start_mark).index;
        (event->end_mark).line = sVar3;
        (event->end_mark).column = (pyVar7->start_mark).column;
        return 1;
      }
      local_48 = (pyVar7->end_mark).column;
      local_58 = (pyVar7->end_mark).index;
      sStack_50 = (pyVar7->end_mark).line;
      iVar11 = 0;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      parser->stream_end_produced = 0;
      (parser->tokens).head = pyVar7 + 1;
      iVar12 = yaml_parser_fetch_more_tokens(parser);
      if (iVar12 == 0) {
        return 0;
      }
      pyVar7 = (parser->tokens).head;
      if (pyVar7 == (yaml_token_t *)0x0) {
        return 0;
      }
      yVar2 = pyVar7->type;
      if ((YAML_VALUE_TOKEN < yVar2) ||
         ((0x34200U >> (yVar2 & (YAML_KEY_TOKEN|YAML_FLOW_ENTRY_TOKEN)) & 1) == 0)) {
        pyVar9 = (parser->states).top;
        if (pyVar9 == (parser->states).end) {
          ppyVar1 = &(parser->states).top;
          iVar12 = yaml_stack_extend(&(parser->states).start,ppyVar1,&(parser->states).end);
          if (iVar12 == 0) goto LAB_001abf57;
          pyVar9 = *ppyVar1;
        }
        (parser->states).top = pyVar9 + 1;
        *pyVar9 = YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE;
        iVar12 = 0;
LAB_001ac169:
        iVar12 = yaml_parser_parse_node(parser,event,1,iVar12);
        return iVar12;
      }
      parser->state = YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE;
LAB_001abeeb:
      pyVar8 = (yaml_char_t *)yaml_malloc(1);
      if (pyVar8 == (yaml_char_t *)0x0) {
        iVar11 = 0;
        goto LAB_001abf57;
      }
LAB_001abefa:
      *pyVar8 = '\0';
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      parser = (yaml_parser_t *)&(event->data).scalar.style;
      event->type = YAML_SCALAR_EVENT;
      (event->start_mark).index = local_58;
      (event->start_mark).line = sStack_50;
      (event->start_mark).column = local_48;
      (event->end_mark).index = local_58;
      (event->end_mark).line = sStack_50;
      (event->end_mark).column = local_48;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).scalar.value = pyVar8;
      (event->data).scalar.plain_implicit = 1;
      iVar11 = 1;
LAB_001abf57:
      parser->error = YAML_PLAIN_SCALAR_STYLE;
      return iVar11;
    }
    break;
  case YAML_PARSE_BLOCK_MAPPING_FIRST_KEY_STATE:
    iVar12 = 1;
    goto LAB_001abc63;
  case YAML_PARSE_BLOCK_MAPPING_KEY_STATE:
    iVar12 = 0;
LAB_001abc63:
    iVar12 = yaml_parser_parse_block_mapping_key(parser,event,iVar12);
    return iVar12;
  case YAML_PARSE_BLOCK_MAPPING_VALUE_STATE:
    if (((parser->token_available != 0) ||
        (iVar12 = yaml_parser_fetch_more_tokens(parser), iVar12 != 0)) &&
       (pyVar7 = (parser->tokens).head, pyVar7 != (yaml_token_t *)0x0)) {
      if (pyVar7->type != YAML_VALUE_TOKEN) {
        parser->state = YAML_PARSE_BLOCK_MAPPING_KEY_STATE;
        goto LAB_001abeda;
      }
      local_48 = (pyVar7->end_mark).column;
      local_58 = (pyVar7->end_mark).index;
      sStack_50 = (pyVar7->end_mark).line;
      iVar11 = 0;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      parser->stream_end_produced = 0;
      (parser->tokens).head = pyVar7 + 1;
      iVar12 = yaml_parser_fetch_more_tokens(parser);
      if (iVar12 == 0) {
        return 0;
      }
      pyVar7 = (parser->tokens).head;
      if (pyVar7 == (yaml_token_t *)0x0) {
        return 0;
      }
      yVar2 = pyVar7->type;
      if ((YAML_VALUE_TOKEN < yVar2) ||
         ((0x30200U >> (yVar2 & (YAML_KEY_TOKEN|YAML_FLOW_ENTRY_TOKEN)) & 1) == 0)) {
        pyVar9 = (parser->states).top;
        if (pyVar9 == (parser->states).end) {
          ppyVar1 = &(parser->states).top;
          iVar12 = yaml_stack_extend(&(parser->states).start,ppyVar1,&(parser->states).end);
          if (iVar12 == 0) goto LAB_001abf57;
          pyVar9 = *ppyVar1;
        }
        (parser->states).top = pyVar9 + 1;
        *pyVar9 = YAML_PARSE_BLOCK_MAPPING_KEY_STATE;
        iVar12 = 1;
        goto LAB_001ac169;
      }
      parser->state = YAML_PARSE_BLOCK_MAPPING_KEY_STATE;
      goto LAB_001abeeb;
    }
    break;
  case YAML_PARSE_FLOW_SEQUENCE_FIRST_ENTRY_STATE:
    iVar12 = 1;
    goto LAB_001abafc;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_STATE:
    iVar12 = 0;
LAB_001abafc:
    iVar12 = yaml_parser_parse_flow_sequence_entry(parser,event,iVar12);
    return iVar12;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_KEY_STATE:
    if ((parser->token_available != 0) ||
       (iVar12 = yaml_parser_fetch_more_tokens(parser), iVar12 != 0)) {
      pyVar7 = (parser->tokens).head;
      iVar11 = 0;
      if (pyVar7 == (yaml_token_t *)0x0) {
        return 0;
      }
      if ((YAML_VALUE_TOKEN < pyVar7->type) ||
         ((0x28800U >> (pyVar7->type & (YAML_KEY_TOKEN|YAML_FLOW_ENTRY_TOKEN)) & 1) == 0)) {
        pyVar9 = (parser->states).top;
        if (pyVar9 == (parser->states).end) {
          ppyVar1 = &(parser->states).top;
          iVar12 = yaml_stack_extend(&(parser->states).start,ppyVar1,&(parser->states).end);
          if (iVar12 == 0) goto LAB_001abf57;
          pyVar9 = *ppyVar1;
        }
        (parser->states).top = pyVar9 + 1;
        *pyVar9 = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_VALUE_STATE;
        goto switchD_001ab898_caseD_7;
      }
      local_48 = (pyVar7->end_mark).column;
      local_58 = (pyVar7->end_mark).index;
      sStack_50 = (pyVar7->end_mark).line;
      iVar11 = 0;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      parser->stream_end_produced = 0;
      (parser->tokens).head = pyVar7 + 1;
      parser->state = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_VALUE_STATE;
      pyVar8 = (yaml_char_t *)yaml_malloc(1);
      if (pyVar8 == (yaml_char_t *)0x0) goto LAB_001abf57;
      goto LAB_001abefa;
    }
    break;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_VALUE_STATE:
    if (((parser->token_available != 0) ||
        (iVar12 = yaml_parser_fetch_more_tokens(parser), iVar12 != 0)) &&
       (pyVar7 = (parser->tokens).head, pyVar7 != (yaml_token_t *)0x0)) {
      if (pyVar7->type == YAML_VALUE_TOKEN) {
        iVar11 = 0;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = 0;
        (parser->tokens).head = pyVar7 + 1;
        iVar12 = yaml_parser_fetch_more_tokens(parser);
        if (iVar12 == 0) {
          return 0;
        }
        pyVar7 = (parser->tokens).head;
        if (pyVar7 == (yaml_token_t *)0x0) {
          return 0;
        }
        if ((pyVar7->type | YAML_TAG_DIRECTIVE_TOKEN) != YAML_FLOW_ENTRY_TOKEN) {
          pyVar9 = (parser->states).top;
          if (pyVar9 == (parser->states).end) {
            ppyVar1 = &(parser->states).top;
            iVar12 = yaml_stack_extend(&(parser->states).start,ppyVar1,&(parser->states).end);
            if (iVar12 == 0) goto LAB_001abf57;
            pyVar9 = *ppyVar1;
          }
          (parser->states).top = pyVar9 + 1;
          *pyVar9 = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_END_STATE;
          goto switchD_001ab898_caseD_7;
        }
      }
      parser->state = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_END_STATE;
LAB_001abeda:
      local_48 = (pyVar7->start_mark).column;
      local_58 = (pyVar7->start_mark).index;
      sStack_50 = (pyVar7->start_mark).line;
      goto LAB_001abeeb;
    }
    break;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_END_STATE:
    if (((parser->token_available != 0) ||
        (iVar12 = yaml_parser_fetch_more_tokens(parser), iVar12 != 0)) &&
       (pyVar7 = (parser->tokens).head, pyVar7 != (yaml_token_t *)0x0)) {
      parser->state = YAML_PARSE_FLOW_SEQUENCE_ENTRY_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->end_mark).column = 0;
      event->type = YAML_MAPPING_END_EVENT;
      sVar3 = (pyVar7->start_mark).line;
      (event->start_mark).index = (pyVar7->start_mark).index;
      (event->start_mark).line = sVar3;
      (event->start_mark).column = (pyVar7->start_mark).column;
      sVar3 = (pyVar7->start_mark).line;
      (event->end_mark).index = (pyVar7->start_mark).index;
      (event->end_mark).line = sVar3;
      (event->end_mark).column = (pyVar7->start_mark).column;
      return 1;
    }
    break;
  case YAML_PARSE_FLOW_MAPPING_FIRST_KEY_STATE:
    iVar12 = 1;
    goto LAB_001abc4c;
  case YAML_PARSE_FLOW_MAPPING_KEY_STATE:
    iVar12 = 0;
LAB_001abc4c:
    iVar12 = yaml_parser_parse_flow_mapping_key(parser,event,iVar12);
    return iVar12;
  case YAML_PARSE_FLOW_MAPPING_VALUE_STATE:
    iVar12 = 0;
    goto LAB_001abec0;
  case YAML_PARSE_FLOW_MAPPING_EMPTY_VALUE_STATE:
    iVar12 = 1;
LAB_001abec0:
    iVar12 = yaml_parser_parse_flow_mapping_value(parser,event,iVar12);
    return iVar12;
  case YAML_PARSE_END_STATE:
    goto switchD_001ab898_caseD_17;
  }
  iVar12 = 0;
switchD_001ab898_caseD_17:
  return iVar12;
}

Assistant:

YAML_DECLARE(int)
yaml_parser_parse(yaml_parser_t *parser, yaml_event_t *event)
{
    assert(parser);     /* Non-NULL parser object is expected. */
    assert(event);      /* Non-NULL event object is expected. */

    /* Erase the event object. */

    memset(event, 0, sizeof(yaml_event_t));

    /* No events after the end of the stream or error. */

    if (parser->stream_end_produced || parser->error ||
            parser->state == YAML_PARSE_END_STATE) {
        return 1;
    }

    /* Generate the next event. */

    return yaml_parser_state_machine(parser, event);
}